

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

void __thiscall OpenMD::InteractionManager::InteractionManager(InteractionManager *this)

{
  undefined8 *in_RDI;
  shared_ptr<OpenMD::EAM> *in_stack_fffffffffffffe58;
  shared_ptr<OpenMD::EAM> *in_stack_fffffffffffffe60;
  shared_ptr<OpenMD::InversePowerSeries> *this_00;
  shared_ptr<OpenMD::InversePowerSeries> local_b8 [11];
  
  *in_RDI = &PTR__InteractionManager_005060e8;
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[2] = 0;
  std::shared_ptr<OpenMD::LJ>::shared_ptr
            ((shared_ptr<OpenMD::LJ> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::GB>::shared_ptr
            ((shared_ptr<OpenMD::GB> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Sticky>::shared_ptr
            ((shared_ptr<OpenMD::Sticky> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::EAM>::shared_ptr(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::SC>::shared_ptr
            ((shared_ptr<OpenMD::SC> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Morse>::shared_ptr
            ((shared_ptr<OpenMD::Morse> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Electrostatic>::shared_ptr
            ((shared_ptr<OpenMD::Electrostatic> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::RepulsivePower>::shared_ptr
            ((shared_ptr<OpenMD::RepulsivePower> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Mie>::shared_ptr
            ((shared_ptr<OpenMD::Mie> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::MAW>::shared_ptr
            ((shared_ptr<OpenMD::MAW> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::InversePowerSeries>::shared_ptr
            ((shared_ptr<OpenMD::InversePowerSeries> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58);
  std::
  map<int,_OpenMD::AtomType_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::AtomType_*>_>_>
  ::map((map<int,_OpenMD::AtomType_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::AtomType_*>_>_>
         *)0x38ff05);
  std::
  vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ::vector((vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
            *)0x38ff21);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x38ff3d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x38ff59);
  *(undefined1 *)(in_RDI + 1) = 0;
  std::make_shared<OpenMD::LJ>();
  std::shared_ptr<OpenMD::LJ>::operator=
            ((shared_ptr<OpenMD::LJ> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::LJ> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::LJ>::~shared_ptr((shared_ptr<OpenMD::LJ> *)0x38ff9c);
  std::make_shared<OpenMD::GB>();
  std::shared_ptr<OpenMD::GB>::operator=
            ((shared_ptr<OpenMD::GB> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::GB> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::GB>::~shared_ptr((shared_ptr<OpenMD::GB> *)0x38ffd3);
  std::make_shared<OpenMD::Sticky>();
  std::shared_ptr<OpenMD::Sticky>::operator=
            ((shared_ptr<OpenMD::Sticky> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::Sticky> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Sticky>::~shared_ptr((shared_ptr<OpenMD::Sticky> *)0x39000a);
  std::make_shared<OpenMD::Morse>();
  std::shared_ptr<OpenMD::Morse>::operator=
            ((shared_ptr<OpenMD::Morse> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::Morse> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Morse>::~shared_ptr((shared_ptr<OpenMD::Morse> *)0x390041);
  std::make_shared<OpenMD::RepulsivePower>();
  std::shared_ptr<OpenMD::RepulsivePower>::operator=
            ((shared_ptr<OpenMD::RepulsivePower> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::RepulsivePower> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::RepulsivePower>::~shared_ptr
            ((shared_ptr<OpenMD::RepulsivePower> *)0x39007b);
  std::make_shared<OpenMD::Mie>();
  std::shared_ptr<OpenMD::Mie>::operator=
            ((shared_ptr<OpenMD::Mie> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::Mie> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Mie>::~shared_ptr((shared_ptr<OpenMD::Mie> *)0x3900b5);
  std::make_shared<OpenMD::EAM>();
  std::shared_ptr<OpenMD::EAM>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::EAM>::~shared_ptr((shared_ptr<OpenMD::EAM> *)0x3900ec);
  std::make_shared<OpenMD::SC>();
  std::shared_ptr<OpenMD::SC>::operator=
            ((shared_ptr<OpenMD::SC> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::SC> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::SC>::~shared_ptr((shared_ptr<OpenMD::SC> *)0x390123);
  std::make_shared<OpenMD::Electrostatic>();
  std::shared_ptr<OpenMD::Electrostatic>::operator=
            ((shared_ptr<OpenMD::Electrostatic> *)in_stack_fffffffffffffe60,
             (shared_ptr<OpenMD::Electrostatic> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::Electrostatic>::~shared_ptr((shared_ptr<OpenMD::Electrostatic> *)0x39015a)
  ;
  std::make_shared<OpenMD::MAW>();
  this_00 = local_b8;
  std::shared_ptr<OpenMD::MAW>::operator=
            ((shared_ptr<OpenMD::MAW> *)this_00,(shared_ptr<OpenMD::MAW> *)in_stack_fffffffffffffe58
            );
  std::shared_ptr<OpenMD::MAW>::~shared_ptr((shared_ptr<OpenMD::MAW> *)0x390194);
  std::make_shared<OpenMD::InversePowerSeries>();
  std::shared_ptr<OpenMD::InversePowerSeries>::operator=
            (this_00,(shared_ptr<OpenMD::InversePowerSeries> *)in_stack_fffffffffffffe58);
  std::shared_ptr<OpenMD::InversePowerSeries>::~shared_ptr
            ((shared_ptr<OpenMD::InversePowerSeries> *)0x3901cc);
  return;
}

Assistant:

InteractionManager::InteractionManager() {
    initialized_ = false;

    lj_                 = std::make_shared<LJ>();
    gb_                 = std::make_shared<GB>();
    sticky_             = std::make_shared<Sticky>();
    morse_              = std::make_shared<Morse>();
    repulsivePower_     = std::make_shared<RepulsivePower>();
    mie_                = std::make_shared<Mie>();
    eam_                = std::make_shared<EAM>();
    sc_                 = std::make_shared<SC>();
    electrostatic_      = std::make_shared<Electrostatic>();
    maw_                = std::make_shared<MAW>();
    inversePowerSeries_ = std::make_shared<InversePowerSeries>();
  }